

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O2

__m128i shuffle_filter_convolve8_8_ssse3(__m128i *s,int16_t *filter)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  __m128i f [4];
  __m128i local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  auVar1 = *(undefined1 (*) [16])filter;
  local_48 = (__m128i)pshufb(auVar1,_DAT_00430240);
  local_38 = pshufb(auVar1,_DAT_00430250);
  local_28 = pshufb(auVar1,_DAT_00430260);
  local_18 = pshufb(auVar1,_DAT_00430270);
  alVar2 = convolve8_8_ssse3(s,&local_48);
  alVar2[0] = alVar2[0];
  alVar2[1] = alVar2[1];
  return alVar2;
}

Assistant:

static inline __m128i shuffle_filter_convolve8_8_ssse3(
    const __m128i *const s, const int16_t *const filter) {
  __m128i f[4];
  shuffle_filter_ssse3(filter, f);
  return convolve8_8_ssse3(s, f);
}